

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

void __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scaleObj(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *origObj)

{
  int iVar1;
  long in_RSI;
  int i;
  DataArray<int> *colscaleExp;
  int iVar2;
  int in_stack_fffffffffffffeac;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffeb0;
  int in_stack_ffffffffffffff3c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff40;
  undefined4 local_54;
  
  local_54 = 0;
  while( true ) {
    iVar2 = local_54;
    iVar1 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x75020d);
    if (iVar1 <= iVar2) break;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffeb0,
               (cpp_dec_float<200U,_int,_void> *)CONCAT44(in_stack_fffffffffffffeac,iVar2));
    DataArray<int>::operator[]((DataArray<int> *)(in_RSI + 0x178),local_54);
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffffeb0,
               (cpp_dec_float<200U,_int,_void> *)CONCAT44(in_stack_fffffffffffffeac,iVar2));
    local_54 = local_54 + 1;
  }
  return;
}

Assistant:

void SPxScaler<R>::scaleObj(const SPxLPBase<R>& lp, VectorBase<R>& origObj) const
{
   assert(lp.isScaled());

   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;

   for(int i = 0; i < origObj.dim(); ++i)
   {
      origObj[i] = spxLdexp(origObj[i], colscaleExp[i]);
   }
}